

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lgc.c
# Opt level: O3

void luaC_step(lua_State *L)

{
  global_State *g;
  undefined1 auVar1 [16];
  lu_mem lVar2;
  long lVar3;
  ulong uVar4;
  l_mem debt;
  long lVar5;
  
  g = L->l_G;
  if (g->GCdebt < 1) {
    lVar5 = 0;
  }
  else {
    lVar3 = (ulong)g->GCdebt / 200 + 1;
    lVar5 = g->gcstepmul * lVar3;
    if (SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff)) / SEXT816((long)g->gcstepmul),0)
        <= lVar3) {
      lVar5 = 0x7fffffffffffffff;
    }
  }
  if (g->gcrunning == '\0') {
    debt = -24000;
  }
  else {
    do {
      lVar2 = singlestep(L);
      lVar5 = lVar5 - lVar2;
      if (lVar5 < -0x95f) {
        if (g->gcstate != '\a') {
          luaE_setdebt(g,(lVar5 / (long)g->gcstepmul) * 200);
          runafewfinalizers(L);
          return;
        }
        break;
      }
    } while (g->gcstate != '\a');
    uVar4 = g->GCestimate / 100;
    auVar1._8_8_ = 0;
    auVar1._0_8_ = uVar4;
    lVar5 = 0x7fffffffffffffff;
    if ((long)g->gcpause < SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff)) / auVar1,0)) {
      lVar5 = uVar4 * (long)g->gcpause;
    }
    debt = (g->GCdebt + g->totalbytes) - lVar5;
  }
  luaE_setdebt(g,debt);
  return;
}

Assistant:

void luaC_step (lua_State *L) {
  global_State *g = G(L);
  lua_assert(!g->gcemergency);
  if (g->gcrunning) {  /* running? */
    if(isdecGCmodegen(g))
      genstep(L, g);
    else
      incstep(L, g);
  }
}